

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

__pid_t __thiscall kj::Executor::wait(Executor *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  Locked<kj::Executor::Impl::State> lock;
  Vector<kj::_::XThreadEvent_*> eventsToCancelOutsideLock;
  PredicateImpl impl;
  undefined1 local_81;
  Mutex *local_80;
  State *local_78;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1326:3)>
  local_70;
  ArrayBuilder<kj::_::XThreadEvent_*> local_58;
  undefined1 local_30;
  undefined **local_20;
  undefined1 *local_18;
  State *local_10;
  
  local_70.maybeFunc.ptr.field_1.value.eventsToCancelOutsideLock =
       (Vector<kj::_::XThreadEvent_*> *)&local_58;
  local_58.endPtr = (XThreadEvent **)0x0;
  local_58.ptr = (XThreadEvent **)0x0;
  local_58.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_70.maybeFunc.ptr.isSet = true;
  local_70.maybeFunc.ptr.field_1.value.this = this;
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)&local_80,(this->impl).ptr);
  local_20 = &PTR_check_0036d8f8;
  local_18 = &local_81;
  local_10 = local_78;
  local_30 = 0;
  kj::_::Mutex::wait(local_80,&local_20);
  Impl::State::dispatchAll(local_78,(Vector<kj::_::XThreadEvent_*> *)&local_58);
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)&local_80);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1326:3)>
  ::~Deferred(&local_70);
  ArrayBuilder<kj::_::XThreadEvent_*>::dispose(&local_58);
  return extraout_EAX;
}

Assistant:

void Executor::wait() {
  Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
  KJ_DEFER(impl->processAsyncCancellations(eventsToCancelOutsideLock));

  auto lock = impl->state.lockExclusive();

  lock.wait([](const Impl::State& state) {
    return state.isDispatchNeeded();
  });

  lock->dispatchAll(eventsToCancelOutsideLock);
}